

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall PeleLM::set_reasonable_grow_cells_for_R(PeleLM *this,Real time)

{
  int iVar1;
  FabArrayBase *this_00;
  Periodicity *in_RDI;
  Periodicity PVar2;
  MultiFab *React;
  int in_stack_0000032c;
  int in_stack_00000330;
  int in_stack_00000334;
  Geometry *in_stack_00000338;
  MultiFab *in_stack_00000340;
  undefined8 in_stack_ffffffffffffffb8;
  undefined1 cross;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  cross = (undefined1)((ulong)in_stack_ffffffffffffffb8 >> 0x38);
  this_00 = (FabArrayBase *)
            amrex::AmrLevel::get_data
                      ((AmrLevel *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffcc,(Real)in_RDI);
  iVar1 = amrex::FabArrayBase::nGrow(this_00,0);
  if (0 < iVar1) {
    PVar2 = amrex::Geometry::periodicity
                      ((Geometry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_ffffffffffffffd4,PVar2.period.vect[2]),PVar2.period.vect[1],
               PVar2.period.vect[0],in_RDI,(bool)cross);
    amrex::FabArrayBase::nGrow(this_00,0);
    amrex::Extrapolater::FirstOrderExtrap
              (in_stack_00000340,in_stack_00000338,in_stack_00000334,in_stack_00000330,
               in_stack_0000032c);
  }
  return;
}

Assistant:

void
PeleLM::set_reasonable_grow_cells_for_R (Real time)
{
   //
   // Ensure reasonable grow cells for R.
   //
   MultiFab& React = get_data(RhoYdot_Type, time);
   if (React.nGrow() > 0 ) {
      React.FillBoundary(0,NUM_SPECIES, geom.periodicity());
      Extrapolater::FirstOrderExtrap(React, geom, 0, NUM_SPECIES, React.nGrow());
   }
}